

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O0

void h2v1_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                    JSAMPARRAY output_data)

{
  uint uVar1;
  uint local_4c;
  JSAMPROW pJStack_48;
  int bias;
  JSAMPROW outptr;
  JSAMPROW inptr;
  uint local_30;
  JDIMENSION output_cols;
  JDIMENSION outcol;
  int inrow;
  JSAMPARRAY output_data_local;
  JSAMPARRAY input_data_local;
  jpeg_component_info *compptr_local;
  j_compress_ptr cinfo_local;
  
  uVar1 = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  expand_right_edge(input_data,cinfo->max_v_samp_factor,cinfo->image_width,uVar1 * 2);
  for (output_cols = 0; (int)output_cols < cinfo->max_v_samp_factor; output_cols = output_cols + 1)
  {
    outptr = input_data[(int)output_cols];
    local_4c = 0;
    pJStack_48 = output_data[(int)output_cols];
    for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
      *pJStack_48 = (JSAMPLE)((int)((uint)*outptr + (uint)outptr[1] + local_4c) >> 1);
      local_4c = local_4c ^ 1;
      outptr = outptr + 2;
      pJStack_48 = pJStack_48 + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
		 JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow;
  JDIMENSION outcol;
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  register JSAMPROW inptr, outptr;
  register int bias;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor,
		    cinfo->image_width, output_cols * 2);

  for (inrow = 0; inrow < cinfo->max_v_samp_factor; inrow++) {
    outptr = output_data[inrow];
    inptr = input_data[inrow];
    bias = 0;			/* bias = 0,1,0,1,... for successive samples */
    for (outcol = 0; outcol < output_cols; outcol++) {
      *outptr++ = (JSAMPLE) ((GETJSAMPLE(*inptr) + GETJSAMPLE(inptr[1])
			      + bias) >> 1);
      bias ^= 1;		/* 0=>1, 1=>0 */
      inptr += 2;
    }
  }
}